

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmem_allocator.h
# Opt level: O2

void __thiscall
cppcms::impl::
shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
::free(shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
       *this,void *__ptr)

{
  shmem_control::free(process_settings::process_memory,__ptr);
  return;
}

Assistant:

void free(void *p) const
	{
		return mm->free(p);
	}